

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::HandleBlockMap(SingleDocParser *this,EventHandler *eventHandler)

{
  Mark *mark_;
  bool bVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  allocator local_a1;
  string local_a0;
  Token token;
  
  Scanner::pop(this->m_scanner);
  CollectionStack::PushCollectionType
            ((this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl,BlockMap);
  mark_ = &token.mark;
  do {
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      local_a0._0_12_ = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string((string *)&token,"end of map not found",&local_a1);
      ParserException::ParserException(pPVar3,(Mark *)&local_a0,(string *)&token);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    Token::Token(&token,pTVar2);
    if (token.type == KEY) {
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    else {
      if (token.type != VALUE) {
        if (token.type == BLOCK_MAP_END) {
          Scanner::pop(this->m_scanner);
          Token::~Token(&token);
          std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
          pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
                    *)(this->m_pCollectionStack)._M_t.
                      super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
                      .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
          return;
        }
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
        std::__cxx11::string::string((string *)&local_a0,"end of map not found",&local_a1);
        ParserException::ParserException(pPVar3,mark_,&local_a0);
        __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
      }
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,mark_,0);
    }
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
LAB_006ab6db:
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,mark_,0);
    }
    else {
      pTVar2 = Scanner::peek(this->m_scanner);
      if (pTVar2->type != VALUE) goto LAB_006ab6db;
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    Token::~Token(&token);
  } while( true );
}

Assistant:

void SingleDocParser::HandleBlockMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP);

    Token token = m_scanner.peek();
    if (token.type != Token::KEY && token.type != Token::VALUE &&
        token.type != Token::BLOCK_MAP_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_MAP);

    if (token.type == Token::BLOCK_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockMap);
}